

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

LTChannel * LTFlightDataGetCh(dataRefsLT ch)

{
  bool bVar1;
  iterator __last;
  iterator iVar2;
  undefined4 in_EDI;
  iterator iter;
  _Self in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  _List_iterator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>
  in_stack_ffffffffffffffe8;
  pointer local_8;
  
  __last = std::__cxx11::
           list<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
           ::begin(in_stack_ffffffffffffffc8._M_node);
  iVar2 = std::__cxx11::
          list<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
          ::end(in_stack_ffffffffffffffc8._M_node);
  std::
  find_if<std::_List_iterator<std::unique_ptr<LTChannel,std::default_delete<LTChannel>>>,LTFlightDataGetCh(dataRefsLT)::__0>
            (in_stack_ffffffffffffffe8,
             (_List_iterator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>)
             __last._M_node,
             (anon_class_4_1_3fcf6523_for__M_pred)(dataRefsLT)((ulong)iVar2._M_node >> 0x20));
  std::__cxx11::
  list<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
  ::end((list<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
         *)in_stack_ffffffffffffffc8._M_node);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffe8,(_Self *)&stack0xffffffffffffffc8);
  if (bVar1) {
    local_8 = (pointer)0x0;
  }
  else {
    std::_List_iterator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>::operator->
              ((_List_iterator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_> *)
               0x1c7dd2);
    local_8 = std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>::get
                        ((unique_ptr<LTChannel,_std::default_delete<LTChannel>_> *)
                         CONCAT44(in_EDI,in_stack_ffffffffffffffd0));
  }
  return local_8;
}

Assistant:

LTChannel* LTFlightDataGetCh (dataRefsLT ch)
{
    listPtrLTChannelTy::iterator iter =
    std::find_if(listFDC.begin(), listFDC.end(),
                 [ch](const ptrLTChannelTy& pCh)
                 { return pCh->channel == ch; });
    if (iter == listFDC.end())
        return nullptr;
    else
        return iter->get();
}